

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

bool __thiscall
(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer::
handleChild(wasm::Expression*&,wasm::Expression__unsigned_int_
          (void *this,Expression **child,Expression *parent,Index fieldIndex)

{
  CtorEvalExternalInterface *this_00;
  DefiningGlobalInfo global;
  bool bVar1;
  size_type sVar2;
  pointer pGVar3;
  Module *wasm;
  HeapType type;
  RefNull *pRVar4;
  Builder local_58;
  size_t local_50;
  char *local_48;
  uintptr_t local_40;
  GlobalGet *local_38;
  GlobalGet *get;
  Expression *pEStack_28;
  Index fieldIndex_local;
  Expression *parent_local;
  Expression **child_local;
  InitFixer *this_local;
  
  if (*child == (Expression *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    get._4_4_ = fieldIndex;
    pEStack_28 = parent;
    parent_local = (Expression *)child;
    child_local = (Expression **)this;
    local_38 = ::wasm::Expression::dynCast<wasm::GlobalGet>(*child);
    if ((local_38 == (GlobalGet *)0x0) ||
       (sVar2 = std::
                unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                ::count(*(unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                          **)((long)this + 0xe8),&local_38->name), sVar2 != 0)) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = anon_unknown.dwarf_65694::isNullableAndMutable(pEStack_28,get._4_4_);
      if (!bVar1) {
        __assert_fail("isNullableAndMutable(parent, fieldIndex)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                      ,0x2ec,
                      "bool (anonymous namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer::handleChild(Expression *&, Expression *, Index)"
                     );
      }
      this_00 = *(CtorEvalExternalInterface **)((long)this + 0xd8);
      pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         (*(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> **)
                           ((long)this + 0xe0));
      local_50 = (pGVar3->super_Importable).super_Named.name.super_IString.str._M_len;
      local_48 = (pGVar3->super_Importable).super_Named.name.super_IString.str._M_str;
      pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         (*(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> **)
                           ((long)this + 0xe0));
      local_40 = (pGVar3->type).id;
      global.name.super_IString.str._M_str = local_48;
      global.name.super_IString.str._M_len = local_50;
      global.type.id = local_40;
      anon_unknown.dwarf_65694::CtorEvalExternalInterface::addStartFixup
                (this_00,global,get._4_4_,local_38);
      wasm = ::wasm::Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::getModule
                       ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)this);
      ::wasm::Builder::Builder(&local_58,wasm);
      type = ::wasm::Type::getHeapType
                       (&(local_38->super_SpecificExpression<(wasm::Expression::Id)10>).
                         super_Expression.type);
      pRVar4 = ::wasm::Builder::makeRefNull(&local_58,type);
      *(RefNull **)parent_local = pRVar4;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool handleChild(Expression*& child,
                         Expression* parent,
                         Index fieldIndex = 0) {
          if (!child) {
            return false;
          }

          if (auto* get = child->dynCast<GlobalGet>()) {
            if (!readableGlobals.count(get->name)) {
              // This get cannot be read - it is a global that appears after
              // us - and so we must fix it up, using the method mentioned
              // before (setting it to null now, and later in the start
              // function writing to it).
              assert(isNullableAndMutable(parent, fieldIndex));
              evaller.addStartFixup(
                {global->name, global->type}, fieldIndex, get);
              child =
                Builder(*getModule()).makeRefNull(get->type.getHeapType());
              return true;
            }
          }

          return false;
        }